

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::AggressiveDCEPass::MarkLoopConstructAsLiveIfLoopHeader
          (AggressiveDCEPass *this,BasicBlock *basic_block)

{
  Instruction *pIVar1;
  Instruction *inst;
  
  inst = BasicBlock::GetLoopMergeInst(basic_block);
  if (inst == (Instruction *)0x0) {
    return;
  }
  pIVar1 = (basic_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar1 != (Instruction *)0x0) &&
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    AddToWorklist(this,(basic_block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                       sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_)
    ;
    AddToWorklist(this,inst);
    return;
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

void AggressiveDCEPass::MarkLoopConstructAsLiveIfLoopHeader(
    BasicBlock* basic_block) {
  // If this is the header for a loop, then loop structure needs to keep as well
  // because the loop header is also part of the loop.
  Instruction* merge_inst = basic_block->GetLoopMergeInst();
  if (merge_inst != nullptr) {
    AddToWorklist(basic_block->terminator());
    AddToWorklist(merge_inst);
  }
}